

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O0

int linklist_5_3::del_same_(LinkList *a,int x)

{
  node *pnVar1;
  code *pcVar2;
  LinkList w;
  LinkList q;
  LinkList p;
  int x_local;
  LinkList *a_local;
  
  q = *a;
  w = (*a)->next;
  while (w != (LinkList)0x0) {
    if (w->data == x) {
      pnVar1 = w->next;
      q->next = pnVar1;
      free(w);
      w = pnVar1;
    }
    else {
      q = w;
      w = w->next;
    }
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

int del_same_(LinkList &a, int x) {
        LinkList p = a, q = a->next, w;
        while (q != nullptr) {
            if (q->data == x) {
                w = q;
                q = q->next;
                p->next = q;
                free(w);
            } else {
                p = q;
                q = q->next;
            }
        }
    }